

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeMergeTestLogs.cpp
# Opt level: O0

TestCaseResultPtr __thiscall LogHandler::startTestCaseResult(LogHandler *this,char *casePath)

{
  bool bVar1;
  TestCaseResultData *this_00;
  char *in_RDX;
  SharedPtrStateBase *extraout_RDX;
  TestCaseResultPtr TVar3;
  char *casePath_local;
  LogHandler *this_local;
  TestCaseResultPtr *existingResult;
  SharedPtrStateBase *pSVar2;
  
  bVar1 = xe::BatchResult::hasTestCaseResult(*(BatchResult **)(casePath + 8),in_RDX);
  if (bVar1) {
    xe::BatchResult::getTestCaseResult((BatchResult *)this,*(char **)(casePath + 8));
    this_00 = de::SharedPtr<xe::TestCaseResultData>::operator->
                        ((SharedPtr<xe::TestCaseResultData> *)this);
    xe::TestCaseResultData::clear(this_00);
    pSVar2 = extraout_RDX;
  }
  else {
    TVar3 = xe::BatchResult::createTestCaseResult((BatchResult *)this,*(char **)(casePath + 8));
    pSVar2 = TVar3.m_state;
  }
  TVar3.m_state = pSVar2;
  TVar3.m_ptr = (TestCaseResultData *)this;
  return TVar3;
}

Assistant:

xe::TestCaseResultPtr startTestCaseResult (const char* casePath)
	{
		if (m_batchResult->hasTestCaseResult(casePath))
		{
			xe::TestCaseResultPtr existingResult = m_batchResult->getTestCaseResult(casePath);
			existingResult->clear();
			return existingResult;
		}
		else
			return m_batchResult->createTestCaseResult(casePath);
	}